

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O1

void despot::DESPOT::Backup(VNode *vnode)

{
  int iVar1;
  int iVar2;
  log_ostream *plVar3;
  ostream *poVar4;
  long *plVar5;
  QNode *qnode;
  double dVar6;
  
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (3 < iVar1) {
      plVar3 = logging::stream(4);
      std::__ostream_insert<char,std::char_traits<char>>(&plVar3->super_ostream,"- Backup ",9);
      poVar4 = std::ostream::_M_insert<void_const*>(plVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," at depth ",10);
      iVar1 = VNode::depth(vnode);
      plVar5 = (long *)std::ostream::operator<<(poVar4,iVar1);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
    }
  }
  iVar1 = 0;
  do {
    iVar2 = logging::level();
    if (0 < iVar2) {
      iVar2 = logging::level();
      if (3 < iVar2) {
        plVar3 = logging::stream(4);
        std::__ostream_insert<char,std::char_traits<char>>(&plVar3->super_ostream," Iter ",6);
        poVar4 = (ostream *)std::ostream::operator<<(plVar3,iVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        poVar4 = std::ostream::_M_insert<void_const*>(poVar4);
        std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
      }
    }
    Update(vnode);
    qnode = VNode::parent(vnode);
    if (qnode != (QNode *)0x0) {
      Update(qnode);
      iVar2 = logging::level();
      if (0 < iVar2) {
        iVar2 = logging::level();
        if (3 < iVar2) {
          plVar3 = logging::stream(4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&plVar3->super_ostream," Updated Q-node to (",0x14);
          dVar6 = QNode::lower_bound(qnode);
          poVar4 = std::ostream::_M_insert<double>(dVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
          dVar6 = QNode::upper_bound(qnode);
          poVar4 = std::ostream::_M_insert<double>(dVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
          std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
        }
      }
      vnode = QNode::parent(qnode);
      iVar1 = iVar1 + 1;
    }
  } while (qnode != (QNode *)0x0);
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (3 < iVar1) {
      plVar3 = logging::stream(4);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar3->super_ostream,"* Backup complete!",0x12);
      std::ios::widen((char)(plVar3->super_ostream)._vptr_basic_ostream[-3] + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
      return;
    }
  }
  return;
}

Assistant:

void DESPOT::Backup(VNode* vnode) {
	int iter = 0;
	logd << "- Backup " << vnode << " at depth " << vnode->depth() << endl;
	while (true) {
		logd << " Iter " << iter << " " << vnode << endl;

		Update(vnode);

		QNode* parentq = vnode->parent();
		if (parentq == NULL) {
			break;
		}

		Update(parentq);
		logd << " Updated Q-node to (" << parentq->lower_bound() << ", "
			<< parentq->upper_bound() << ")" << endl;

		vnode = parentq->parent();
		iter++;
	}
	logd << "* Backup complete!" << endl;
}